

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeParseContentInternal
              (xmlDoc *doc,xmlNodePtr parent,xmlChar *value,int len,xmlNodePtr *listPtr)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  xmlBufPtr buf;
  xmlEntityPtr parent_00;
  xmlNodePtr pxVar5;
  xmlNodePtr pxVar6;
  xmlChar *pxVar7;
  int iVar8;
  byte *pbVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  xmlChar buffer [10];
  xmlNodePtr local_80;
  xmlChar *local_78;
  xmlNodePtr local_68;
  xmlNodePtr local_58;
  xmlChar local_3a [10];
  
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = (xmlNodePtr)0x0;
  }
  uVar10 = 0x7fffffff;
  if ((uint)len < 0x7fffffff) {
    uVar10 = len;
  }
  if ((value == (xmlChar *)0x0) || (*value == '\0')) {
    local_80 = (xmlNodePtr)0x0;
    pxVar5 = (xmlNodePtr)0x0;
  }
  else {
    buf = xmlBufCreate(0x32);
    if (buf == (xmlBufPtr)0x0) {
      return -1;
    }
    pbVar9 = value;
    if (len != 0) {
      local_68 = (xmlNodePtr)0x0;
      local_80 = (xmlNodePtr)0x0;
      local_78 = (xmlChar *)0x0;
LAB_0014c343:
      bVar1 = *pbVar9;
      local_58 = (xmlNodePtr)(ulong)bVar1;
      if (bVar1 == 0x26) {
        if ((long)pbVar9 - (long)value != 0) {
          uVar3 = xmlBufAdd(buf,value,(long)pbVar9 - (long)value);
          local_58 = (xmlNodePtr)(ulong)uVar3;
          iVar4 = 5;
          if (uVar3 == 0) goto LAB_0014c390;
          goto LAB_0014c798;
        }
LAB_0014c390:
        if (((2 < uVar10) && (pbVar9[1] == 0x23)) && (pbVar9[2] == 0x78)) {
          local_58 = (xmlNodePtr)(pbVar9 + 3);
          iVar4 = uVar10 - 3;
          if (uVar10 != 3) {
            lVar2 = (ulong)(uVar10 - 4) + 4;
            iVar8 = 0;
            do {
              bVar1 = *(byte *)&local_58->_private;
              uVar10 = (uint)bVar1;
              if (bVar1 == 0x3b) goto LAB_0014c58c;
              if ((byte)(bVar1 - 0x30) < 10) {
                iVar8 = iVar8 * 0x10 + (uint)bVar1 + -0x30;
              }
              else if ((byte)(bVar1 + 0x9f) < 6) {
                iVar8 = iVar8 * 0x10 + (uint)bVar1 + -0x57;
              }
              else {
                if (5 < (byte)(bVar1 + 0xbf)) goto LAB_0014c62d;
                iVar8 = iVar8 * 0x10 + (uint)bVar1 + -0x37;
              }
              if (0x10ffff < iVar8) {
                iVar8 = 0x110000;
              }
              local_58 = (xmlNodePtr)((long)&local_58->_private + 1);
              bVar12 = 1 < iVar4;
              iVar4 = iVar4 + -1;
            } while (bVar12);
            goto LAB_0014c4a0;
          }
LAB_0014c585:
          iVar8 = 0;
          bVar12 = false;
          goto LAB_0014c635;
        }
        if ((uVar10 != 1) && (pbVar9[1] == 0x23)) {
          local_58 = (xmlNodePtr)(pbVar9 + 2);
          iVar4 = uVar10 - 2;
          if (uVar10 < 3) goto LAB_0014c585;
          lVar2 = (ulong)(uVar10 - 3) + 3;
          iVar8 = 0;
          do {
            bVar1 = *(byte *)&local_58->_private;
            uVar10 = (uint)bVar1;
            if (bVar1 == 0x3b) goto LAB_0014c58c;
            if (9 < (byte)(bVar1 - 0x30)) goto LAB_0014c62d;
            iVar8 = uVar10 + iVar8 * 10 + -0x30;
            if (0x10ffff < iVar8) {
              iVar8 = 0x110000;
            }
            local_58 = (xmlNodePtr)((long)&local_58->_private + 1);
            bVar12 = 1 < iVar4;
            iVar4 = iVar4 + -1;
          } while (bVar12);
LAB_0014c4a0:
          local_58 = (xmlNodePtr)(pbVar9 + lVar2);
          iVar4 = 0;
          goto LAB_0014c62f;
        }
        value = pbVar9 + 1;
        if (uVar10 < 2) {
          pxVar5 = (xmlNodePtr)&DAT_00000001;
          pbVar9 = value;
          uVar3 = uVar10 - 1;
          uVar11 = uVar10;
        }
        else {
          uVar3 = uVar10 - 2;
          local_58 = (xmlNodePtr)((ulong)uVar3 + 2);
          pxVar6 = (xmlNodePtr)(ulong)uVar10;
          pxVar5 = (xmlNodePtr)&DAT_00000001;
          do {
            if ((pbVar9[(long)pxVar5] == 0) || (pbVar9[(long)pxVar5] == 0x3b)) {
              pbVar9 = pbVar9 + (long)pxVar5;
              uVar3 = uVar10 - 1;
              uVar11 = uVar10;
              goto LAB_0014c50b;
            }
            pxVar5 = (xmlNodePtr)((long)&pxVar5->_private + 1);
            uVar10 = uVar10 - 1;
          } while (pxVar6 != pxVar5);
          pxVar5 = local_58;
          pbVar9 = pbVar9 + (ulong)uVar3 + 2;
          uVar3 = 0;
          uVar11 = 1;
        }
LAB_0014c50b:
        uVar10 = uVar3;
        iVar4 = 4;
        if ((1 < (int)uVar11) && (*pbVar9 != 0)) {
          if (pxVar5 != (xmlNodePtr)&DAT_00000001) {
            local_78 = xmlStrndup(value,(int)pxVar5 + -1);
            iVar4 = 5;
            if (local_78 == (xmlChar *)0x0) {
              local_78 = (xmlChar *)0x0;
              local_58 = (xmlNodePtr)0x0;
              goto LAB_0014c798;
            }
            parent_00 = xmlGetDocEntity(doc,local_78);
            if ((parent_00 == (xmlEntityPtr)0x0) ||
               (parent_00->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
              iVar8 = xmlBufIsEmpty(buf);
              if (iVar8 == 0) {
                local_58 = xmlNewText((xmlChar *)0x0);
                if (local_58 == (xmlNodePtr)0x0) goto LAB_0014c798;
                local_58->doc = doc;
                pxVar7 = xmlBufDetach(buf);
                local_58->content = pxVar7;
                local_58->parent = parent;
                pxVar5 = local_58;
                if (local_80 != (xmlNodePtr)0x0) {
                  local_80->next = local_58;
                  local_58->prev = local_80;
                  pxVar5 = local_68;
                }
              }
              else {
                local_58 = local_80;
                pxVar5 = local_68;
              }
              local_68 = pxVar5;
              if (((parent_00 == (xmlEntityPtr)0x0) || ((parent_00->flags & 9U) != 0)) ||
                 (parent_00->content == (xmlChar *)0x0)) {
LAB_0014c5c6:
                local_80 = xmlNewEntityRef(doc,local_78);
                if (local_80 != (xmlNodePtr)0x0) {
                  local_80->parent = parent;
                  local_80->last = (_xmlNode *)parent_00;
                  if (parent_00 != (xmlEntityPtr)0x0) {
                    local_80->children = (_xmlNode *)parent_00;
                    local_80->content = parent_00->content;
                  }
                  if (local_58 == (xmlNodePtr)0x0) {
                    local_78 = (xmlChar *)0x0;
                    local_68 = local_80;
                  }
                  else {
                    local_58->next = local_80;
                    local_80->prev = local_58;
                    local_78 = (xmlChar *)0x0;
                  }
                  goto LAB_0014c72b;
                }
                local_78 = (xmlChar *)0x0;
              }
              else {
                parent_00->flags = parent_00->flags | 8;
                uVar3 = xmlNodeParseContentInternal
                                  (doc,(xmlNodePtr)parent_00,parent_00->content,-1,(xmlNodePtr *)0x0
                                  );
                parent_00->flags = ~uVar3 >> 0x1f | parent_00->flags & 0xfffffff7U;
                if (-1 < (int)uVar3) goto LAB_0014c5c6;
                iVar4 = ((int)uVar3 >> 0x1f) * -5;
              }
              local_80 = local_58;
              goto LAB_0014c798;
            }
            uVar3 = xmlBufCat(buf,parent_00->content);
            local_58 = (xmlNodePtr)(ulong)uVar3;
            if (uVar3 != 0) goto LAB_0014c798;
LAB_0014c72b:
            local_58 = (xmlNodePtr)(*xmlFree)(local_78);
            local_78 = (xmlChar *)0x0;
          }
          value = pbVar9 + 1;
          uVar10 = uVar11 - 2;
          iVar8 = 0;
          goto LAB_0014c74e;
        }
        goto LAB_0014c798;
      }
      if (bVar1 != 0) {
        pbVar9 = pbVar9 + 1;
        uVar10 = uVar10 - 1;
        goto LAB_0014c7a4;
      }
      goto LAB_0014c838;
    }
    local_78 = (xmlChar *)0x0;
    local_80 = (xmlNodePtr)0x0;
    local_68 = (xmlNodePtr)0x0;
LAB_0014c838:
    if (((long)pbVar9 - (long)value != 0) &&
       (iVar4 = xmlBufAdd(buf,value,(long)pbVar9 - (long)value), iVar4 != 0)) {
LAB_0014c856:
      xmlBufFree(buf);
      if (local_78 != (xmlChar *)0x0) {
        (*xmlFree)(local_78);
      }
      if (local_68 != (xmlNodePtr)0x0) {
        xmlFreeNodeList(local_68);
      }
      return -1;
    }
    iVar4 = xmlBufIsEmpty(buf);
    if (iVar4 == 0) {
      pxVar6 = xmlNewText((xmlChar *)0x0);
      if (pxVar6 == (xmlNodePtr)0x0) goto LAB_0014c856;
      pxVar6->doc = doc;
      pxVar6->parent = parent;
      pxVar7 = xmlBufDetach(buf);
      pxVar6->content = pxVar7;
      pxVar5 = pxVar6;
      if (local_80 != (xmlNodePtr)0x0) {
        local_80->next = pxVar6;
        pxVar6->prev = local_80;
        pxVar5 = local_68;
      }
    }
    else {
      pxVar5 = local_68;
      pxVar6 = local_80;
      if (local_68 == (xmlNodePtr)0x0) {
        pxVar5 = xmlNewText("");
        if (pxVar5 == (xmlNodePtr)0x0) {
          local_68 = (xmlNodePtr)0x0;
          goto LAB_0014c856;
        }
        pxVar5->doc = doc;
        pxVar5->parent = parent;
        pxVar6 = pxVar5;
      }
    }
    local_80 = pxVar6;
    xmlBufFree(buf);
  }
  if (parent != (xmlNodePtr)0x0) {
    if (parent->children != (xmlNodePtr)0x0) {
      xmlFreeNodeList(parent->children);
    }
    parent->children = pxVar5;
    parent->last = local_80;
  }
  if (listPtr != (xmlNodePtr *)0x0) {
    *listPtr = pxVar5;
  }
  return 0;
LAB_0014c58c:
  uVar10 = 0x3b;
  goto LAB_0014c62f;
LAB_0014c62d:
  iVar8 = 0;
LAB_0014c62f:
  bVar12 = uVar10 == 0x3b;
LAB_0014c635:
  value = (xmlChar *)((long)&local_58->_private + (ulong)bVar12);
  uVar10 = iVar4 - (uint)bVar12;
LAB_0014c74e:
  pbVar9 = value;
  if (iVar8 != 0) {
    if (0x10ffff < iVar8) {
      iVar8 = 0xfffd;
    }
    iVar4 = xmlCopyCharMultiByte(local_3a,iVar8);
    local_3a[iVar4] = '\0';
    iVar4 = xmlBufCat(buf,local_3a);
    bVar12 = iVar4 != 0;
    local_58 = (xmlNodePtr)(ulong)CONCAT31((int3)((uint)iVar4 >> 8),bVar12);
    if (bVar12) {
      iVar4 = (uint)bVar12 * 5;
      goto LAB_0014c798;
    }
  }
  iVar4 = 0;
LAB_0014c798:
  if (iVar4 != 0) {
    if (iVar4 == 1) {
      return (int)local_58;
    }
    if (iVar4 != 4) goto LAB_0014c856;
    goto LAB_0014c838;
  }
LAB_0014c7a4:
  if ((int)uVar10 < 1) goto LAB_0014c838;
  goto LAB_0014c343;
}

Assistant:

static int
xmlNodeParseContentInternal(const xmlDoc *doc, xmlNodePtr parent,
                            const xmlChar *value, int len,
                            xmlNodePtr *listPtr) {
    xmlNodePtr head = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val = NULL;
    const xmlChar *cur;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;
    int remaining;

    if (listPtr != NULL)
        *listPtr = NULL;

    if (len < 0)
        remaining = INT_MAX;
    else
        remaining = len;

    if ((value == NULL) || (value[0] == 0))
        goto done;

    cur = value;

    buf = xmlBufCreate(50);
    if (buf == NULL)
        return(-1);

    q = cur;
    while ((remaining > 0) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	        q = cur;
	    }

	    if ((remaining > 2) && (cur[1] == '#') && (cur[2] == 'x')) {
	        int tmp = 0;

		cur += 3;
                remaining -= 3;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else if ((remaining > 1) && (cur[1] == '#')) {
	        int tmp = 0;

		cur += 2;
                remaining -= 2;
		while ((remaining > 0) && ((tmp = *cur) != ';')) {
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			charval = 0;
			break;
		    }
                    if (charval > 0x110000)
                        charval = 0x110000;
		    cur++;
                    remaining--;
		}
		if (tmp == ';') {
		    cur++;
                    remaining--;
                }
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
                remaining--;
		q = cur;
		while ((remaining > 0) && (*cur != 0) && (*cur != ';')) {
                    cur++;
                    remaining--;
                }
		if ((remaining <= 0) || (*cur == 0))
		    break;
		if (cur != q) {
		    val = xmlStrndup(q, cur - q);
                    if (val == NULL)
                        goto out;
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
                        /*
                         * Predefined entities don't generate nodes
                         */
			if (xmlBufCat(buf, ent->content))
			    goto out;
		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL)
				goto out;
			    node->content = xmlBufDetach(buf);
                            node->parent = parent;

			    if (last == NULL) {
				head = node;
			    } else {
                                last->next = node;
                                node->prev = last;
			    }
                            last = node;
			}

			if ((ent != NULL) &&
                            ((ent->flags & XML_ENT_PARSED) == 0) &&
                            ((ent->flags & XML_ENT_EXPANDING) == 0) &&
                            (ent->content != NULL)) {
                            int res;

                            ent->flags |= XML_ENT_EXPANDING;
                            res = xmlNodeParseContentInternal(doc,
                                    (xmlNodePtr) ent, ent->content, -1, NULL);
                            ent->flags &= ~XML_ENT_EXPANDING;
                            if (res < 0)
                                goto out;
                            ent->flags |= XML_ENT_PARSED;
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewEntityRef((xmlDocPtr) doc, val);
                        val = NULL;
			if (node == NULL)
			    goto out;
                        node->parent = parent;
                        node->last = (xmlNodePtr) ent;
                        if (ent != NULL) {
                            node->children = (xmlNodePtr) ent;
                            node->content = ent->content;
                        }

			if (last == NULL) {
			    head = node;
			} else {
                            last->next = node;
                            node->prev = last;
			}
                        last = node;
		    }
		    xmlFree(val);
                    val = NULL;
		}
		cur++;
                remaining--;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

                if (charval >= 0x110000)
                    charval = 0xFFFD; /* replacement character */

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
	    }
	} else {
	    cur++;
            remaining--;
        }
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL)
            goto out;
        node->parent = parent;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    head = node;
	} else {
            last->next = node;
            node->prev = last;
	}
        last = node;
    } else if (head == NULL) {
        head = xmlNewDocText(doc, BAD_CAST "");
        if (head == NULL)
            goto out;
        head->parent = parent;
        last = head;
    }

    xmlBufFree(buf);

done:
    if (parent != NULL) {
        if (parent->children != NULL)
            xmlFreeNodeList(parent->children);
        parent->children = head;
        parent->last = last;
    }

    if (listPtr != NULL)
        *listPtr = head;

    return(0);

out:
    xmlBufFree(buf);
    if (val != NULL)
        xmlFree(val);
    if (head != NULL)
        xmlFreeNodeList(head);
    return(-1);
}